

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,int startPos,int endPos
          ,Context *context)

{
  Type TVar1;
  undefined8 uVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  uint uVar6;
  QString *pQVar7;
  int i;
  ulong uVar8;
  long pos;
  Tag *this_00;
  QStringView QVar9;
  QString tagEndMarker;
  Tag tag;
  Tag endTag;
  QString partialContent;
  QString partialRendered;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  do {
    if (this->m_errorPos != -1) {
      return __return_storage_ptr__;
    }
    findTag(&tag,this,_template,startPos,endPos);
    TVar1 = tag.type;
    pos = (long)startPos;
    if (tag.type == Null) {
      endTag.key.d.d = (Data *)(_template->d).ptr;
      endTag._0_8_ = (_template->d).size;
      QVar9 = QStringView::mid((QStringView *)&endTag,pos,(long)(endPos - startPos));
      QString::append((QChar *)__return_storage_ptr__,(longlong)QVar9.m_data);
      goto switchD_00111428_default;
    }
    endTag.key.d.d = (Data *)(_template->d).ptr;
    endTag._0_8_ = (_template->d).size;
    QVar9 = QStringView::mid((QStringView *)&endTag,pos,tag.start - pos);
    QString::append((QChar *)__return_storage_ptr__,(longlong)QVar9.m_data);
    switch(tag.type) {
    case Value:
      this_00 = &endTag;
      (*context->_vptr_Context[2])(this_00,context,&tag.key);
      if (tag.escapeMode == Unescape) {
        unescapeHtml((QString *)&tagEndMarker.d,(QString *)this_00);
LAB_001118da:
        pcVar4 = endTag.key.d.ptr;
        pDVar3 = endTag.key.d.d;
        uVar2 = endTag._0_8_;
        endTag._0_8_ = tagEndMarker.d.d;
        endTag.key.d.d = (Data *)tagEndMarker.d.ptr;
        tagEndMarker.d.d = (Data *)uVar2;
        tagEndMarker.d.ptr = (char16_t *)pDVar3;
        endTag.key.d.ptr = (char16_t *)tagEndMarker.d.size;
        tagEndMarker.d.size = (qsizetype)pcVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
      }
      else if (tag.escapeMode == Escape) {
        escapeHtml((QString *)&tagEndMarker.d,(QString *)this_00);
        goto LAB_001118da;
      }
      QString::append((QString *)__return_storage_ptr__);
      startPos = tag.end;
      break;
    case SectionStart:
      findEndTag(&endTag,this,_template,&tag,endPos);
      if (endTag.type == Null) {
        if (this->m_errorPos == -1) {
          QString::QString(&tagEndMarker,"No matching end tag found for section");
          setError(this,&tagEndMarker,tag.start);
LAB_001118c2:
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
        }
      }
      else {
        iVar5 = (*context->_vptr_Context[4])(context,&tag.key);
        if (iVar5 < 1) {
          iVar5 = (*context->_vptr_Context[7])(context,&tag.key);
          if ((char)iVar5 == '\0') {
            iVar5 = (*context->_vptr_Context[3])(context,&tag.key);
            startPos = endTag.end;
            if ((char)iVar5 == '\0') {
              (*context->_vptr_Context[5])(context,&tag.key,0xffffffffffffffff);
              render((QString *)&tagEndMarker.d,this,_template,tag.end,endTag.start,context);
              QString::append((QString *)__return_storage_ptr__);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
              (*context->_vptr_Context[6])(context);
              startPos = endTag.end;
            }
          }
          else {
            QString::mid((longlong)&partialContent,(longlong)_template);
            (*context->_vptr_Context[8])(&tagEndMarker.d,context,&tag.key,&partialContent,this);
            QString::append((QString *)__return_storage_ptr__);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialContent.d);
            startPos = endTag.end;
          }
        }
        else {
          for (uVar8 = 0; startPos = endTag.end, iVar5 != (int)uVar8;
              uVar8 = (ulong)((int)uVar8 + 1)) {
            (*context->_vptr_Context[5])(context,&tag.key,uVar8);
            render((QString *)&tagEndMarker.d,this,_template,tag.end,endTag.start,context);
            QString::append((QString *)__return_storage_ptr__);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
            (*context->_vptr_Context[6])(context);
          }
        }
      }
      goto LAB_00111a0e;
    case InvertedSectionStart:
      findEndTag(&endTag,this,_template,&tag,endPos);
      if (endTag.type == Null) {
        if (this->m_errorPos == -1) {
          QString::QString((QString *)&tagEndMarker.d,
                           "No matching end tag found for inverted section");
          setError(this,(QString *)&tagEndMarker.d,tag.start);
          goto LAB_001118c2;
        }
      }
      else {
        iVar5 = (*context->_vptr_Context[3])(context,&tag.key);
        startPos = endTag.end;
        if ((char)iVar5 != '\0') {
          render((QString *)&tagEndMarker.d,this,_template,tag.end,endTag.start,context);
          QString::append((QString *)__return_storage_ptr__);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
          startPos = endTag.end;
        }
      }
LAB_00111a0e:
      this_00 = (Tag *)&endTag.key;
      break;
    case SectionEnd:
      QString::QString((QString *)&endTag,"Unexpected end tag");
      setError(this,(QString *)&endTag,tag.start);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&endTag);
    case Comment:
    case SetDelimiter:
      startPos = tag.end;
      goto switchD_00111428_default;
    case Partial:
      endTag._0_8_ = (this->m_tagStartMarker).d.d;
      endTag.key.d.d = (Data *)(this->m_tagStartMarker).d.ptr;
      endTag.key.d.ptr = (char16_t *)(this->m_tagStartMarker).d.size;
      if ((Data *)endTag._0_8_ != (Data *)0x0) {
        LOCK();
        (((Data *)endTag._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (((Data *)endTag._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      tagEndMarker.d.d = (this->m_tagEndMarker).d.d;
      tagEndMarker.d.ptr = (this->m_tagEndMarker).d.ptr;
      tagEndMarker.d.size = (this->m_tagEndMarker).d.size;
      if (tagEndMarker.d.d != (Data *)0x0) {
        LOCK();
        ((tagEndMarker.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((tagEndMarker.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::operator=(&this->m_tagStartMarker,(QString *)&this->m_defaultTagStartMarker);
      QString::operator=(&this->m_tagEndMarker,(QString *)&this->m_defaultTagEndMarker);
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)this,&tag.key);
      Context::partialValue(&partialContent,context,&tag.key);
      if (0 < tag.indentation) {
        QString::QString((QString *)&local_60," ");
        QString::repeated((longlong)&partialRendered.d);
        QString::append((QString *)__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialRendered.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        QString::QString((QString *)&partialRendered.d,"\n");
        for (uVar6 = QString::indexOf((QString *)&partialContent,(longlong)&partialRendered.d,
                                      CaseInsensitive);
            (QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialRendered.d), 0 < (int)uVar6 &&
            ((long)(ulong)(uVar6 & 0x7fffffff) <
             CONCAT44(partialContent.d.size._4_4_,(int)partialContent.d.size) + -1));
            uVar6 = QString::indexOf((QString *)&partialContent,(longlong)&partialRendered.d,
                                     uVar6 + CaseSensitive)) {
          QString::QString((QString *)&local_60," ");
          QString::repeated((longlong)&partialRendered.d);
          pQVar7 = QString::insert(&partialContent,(ulong)(uVar6 + CaseSensitive),
                                   (QString *)&partialRendered.d);
          QString::operator=(&partialContent,(QString *)pQVar7);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialRendered.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          QString::QString((QString *)&partialRendered.d,"\n");
        }
      }
      render(&partialRendered,this,&partialContent,0,(int)partialContent.d.size,context);
      QString::append((QString *)__return_storage_ptr__);
      startPos = tag.end;
      QStack<QString>::pop((QString *)&local_48,&this->m_partialStack);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      this_00 = &endTag;
      QString::operator=(&this->m_tagStartMarker,(QString *)this_00);
      QString::operator=(&this->m_tagEndMarker,(QString *)&tagEndMarker.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialRendered.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&partialContent.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&tagEndMarker.d);
      break;
    default:
      goto switchD_00111428_default;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
switchD_00111428_default:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&tag.key.d);
    if (TVar1 == Null) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QString Renderer::render(const QString& _template, int startPos, int endPos, Context* context)
{
	QString output;
	int lastTagEnd = startPos;

	while (m_errorPos == -1) {
		Tag tag = findTag(_template, lastTagEnd, endPos);
		if (tag.type == Tag::Null) {
			output += QStringView(_template).mid(lastTagEnd, endPos - lastTagEnd);
			break;
		}
		output += QStringView(_template).mid(lastTagEnd, tag.start - lastTagEnd);
		switch (tag.type) {
		case Tag::Value:
		{
			QString value = context->stringValue(tag.key);
			if (tag.escapeMode == Tag::Escape) {
				value = escapeHtml(value);
			} else if (tag.escapeMode == Tag::Unescape) {
				value = unescapeHtml(value);
			}
			output += value;
			lastTagEnd = tag.end;
		}
		break;
		case Tag::SectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for section", tag.start);
				}
			} else {
				int listCount = context->listCount(tag.key);
				if (listCount > 0) {
					for (int i=0; i < listCount; i++) {
						context->push(tag.key, i);
						output += render(_template, tag.end, endTag.start, context);
						context->pop();
					}
				} else if (context->canEval(tag.key)) {
					output += context->eval(tag.key, _template.mid(tag.end, endTag.start - tag.end), this);
				} else if (!context->isFalse(tag.key)) {
					context->push(tag.key);
					output += render(_template, tag.end, endTag.start, context);
					context->pop();
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::InvertedSectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for inverted section", tag.start);
				}
			} else {
				if (context->isFalse(tag.key)) {
					output += render(_template, tag.end, endTag.start, context);
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::SectionEnd:
			setError("Unexpected end tag", tag.start);
			lastTagEnd = tag.end;
			break;
		case Tag::Partial:
		{
			QString tagStartMarker = m_tagStartMarker;
			QString tagEndMarker = m_tagEndMarker;

			m_tagStartMarker = m_defaultTagStartMarker;
			m_tagEndMarker = m_defaultTagEndMarker;

			m_partialStack.push(tag.key);

			QString partialContent = context->partialValue(tag.key);

			// If there is a need to add a special indentation to the partial
			if (tag.indentation > 0) {
				output += QString(" ").repeated(tag.indentation);
				// Indenting the output to keep the parent indentation.
				int posOfLF = partialContent.indexOf("\n", 0);
				while (posOfLF > 0 && posOfLF < (partialContent.length() - 1)) { // .length() - 1 because we dont want indentation AFTER the last character if it's a LF
					partialContent = partialContent.insert(posOfLF + 1, QString(" ").repeated(tag.indentation));
					posOfLF = partialContent.indexOf("\n", posOfLF + 1);
				}
			}

			QString partialRendered = render(partialContent, 0, partialContent.length(), context);

			output += partialRendered;

			lastTagEnd = tag.end;

			m_partialStack.pop();

			m_tagStartMarker = tagStartMarker;
			m_tagEndMarker = tagEndMarker;
		}
		break;
		case Tag::SetDelimiter:
			lastTagEnd = tag.end;
			break;
		case Tag::Comment:
			lastTagEnd = tag.end;
			break;
		case Tag::Null:
			break;
		}
	}

	return output;
}